

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wdgl.cpp
# Opt level: O3

void * rw::wdgl::skinOpen(void *o,int32 param_2,int32 param_3)

{
  ObjPipeline *this;
  
  allocLocation =
       "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/gl/wdgl.cpp line: 536"
  ;
  this = (ObjPipeline *)(*DAT_00149858)(0x40,0x40000);
  rw::ObjPipeline::init(this,(EVP_PKEY_CTX *)0xc);
  (this->impl).instance = instance;
  (this->impl).uninstance = uninstance;
  (this->super_Pipeline).pluginID = 0x116;
  (this->super_Pipeline).pluginData = 1;
  this[1].super_Pipeline.pluginID = 2;
  *(code **)&this[1].super_Pipeline.platform = skinInstanceCB;
  this[1].impl.instance = skinUninstanceCB;
  DAT_00149d88 = this;
  return o;
}

Assistant:

static void*
skinOpen(void *o, int32, int32)
{
	skinGlobals.pipelines[PLATFORM_WDGL] = makeSkinPipeline();
	return o;
}